

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O3

void query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
               (kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
                *tree)

{
  long *plVar1;
  search_nn<pico_tree::neighbor<int,_float>_> v;
  neighbor<int,_float> nn;
  float query [3];
  search_nn<pico_tree::neighbor<int,_float>_> local_68;
  neighbor_type local_60;
  float local_58 [4];
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<float[3]>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  local_48;
  
  local_48.visitor_ = &local_68;
  local_48.query_.point_ = (point_type *)local_58;
  local_58[0] = 4.0;
  local_58[1] = 4.0;
  local_58[2] = 4.0;
  local_68.nn_ = &local_60;
  local_60.distance = 3.4028235e+38;
  local_48.indices_ = &(tree->data_).indices;
  local_48.node_box_offset_.elems_._M_elems[2] = 0.0;
  local_48.node_box_offset_.elems_._M_elems[0] = 0.0;
  local_48.node_box_offset_.elems_._M_elems[1] = 0.0;
  local_48.space_.space_ = &tree->space_;
  pico_tree::internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<float[3]>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  ::search_nearest(&local_48,(tree->data_).root_node,0.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Index closest point: ",0x15);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_60.index);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void query_tree(Tree_ const& tree) {
  float query[3] = {4.0f, 4.0f, 4.0f};
  pico_tree::neighbor<int, float> nn;
  tree.search_nn(query, nn);

  std::cout << "Index closest point: " << nn.index << std::endl;
}